

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcValue.cpp
# Opt level: O3

bool __thiscall XmlRpc::XmlRpcValue::arrayFromXml(XmlRpcValue *this,string *valueXml,int *offset)

{
  bool bVar1;
  bool bVar2;
  BinaryData *pBVar3;
  XmlRpcValue v;
  XmlRpcValue local_38;
  
  bVar1 = XmlRpcUtil::nextTagIs("<data>",valueXml,offset);
  if (bVar1) {
    this->_type = TypeArray;
    pBVar3 = (BinaryData *)operator_new(0x18);
    (pBVar3->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (pBVar3->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    (pBVar3->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    (this->_value).asBinary = pBVar3;
    local_38._type = TypeInvalid;
    local_38._value.asDouble = 0.0;
    while( true ) {
      bVar2 = fromXml(&local_38,valueXml,offset);
      if (!bVar2) break;
      std::vector<XmlRpc::XmlRpcValue,_std::allocator<XmlRpc::XmlRpcValue>_>::push_back
                ((vector<XmlRpc::XmlRpcValue,_std::allocator<XmlRpc::XmlRpcValue>_> *)
                 (this->_value).asTime,&local_38);
    }
    XmlRpcUtil::nextTagIs("</data>",valueXml,offset);
    invalidate(&local_38);
  }
  return bVar1;
}

Assistant:

bool XmlRpcValue::arrayFromXml(std::string const& valueXml, int* offset)
  {
    if ( ! XmlRpcUtil::nextTagIs(DATA_TAG, valueXml, offset))
      return false;

    _type = TypeArray;
    _value.asArray = new ValueArray;
    XmlRpcValue v;
    while (v.fromXml(valueXml, offset))
      _value.asArray->push_back(v);       // copy...

    // Skip the trailing </data>
    (void) XmlRpcUtil::nextTagIs(DATA_ETAG, valueXml, offset);
    return true;
  }